

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Environmental_Process_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Environmental_Process_PDU::Encode(Environmental_Process_PDU *this,KDataStream *stream)

{
  pointer pKVar1;
  pointer pKVar2;
  
  Header7::Encode(&this->super_Header,stream);
  (*(this->m_EnvProcID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_EnvProcID,stream);
  (*(this->m_EnvType).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_EnvType,stream);
  KDataStream::Write(stream,this->m_ui8ModelType);
  KDataStream::Write(stream,(this->field_3).m_ui8EnvStatus);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16NumEnvRec);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16SeqNum);
  pKVar1 = (this->m_vEnvRecords).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pKVar2 = (this->m_vEnvRecords).
                super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pKVar2 != pKVar1; pKVar2 = pKVar2 + 1) {
    (*(pKVar2->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[5])(pKVar2->m_pRef,stream);
  }
  return;
}

Assistant:

void Environmental_Process_PDU::Encode( KDataStream & stream ) const
{
    Header::Encode( stream );

    stream << KDIS_STREAM m_EnvProcID
           << KDIS_STREAM m_EnvType
           << m_ui8ModelType
           << m_ui8EnvStatus
           << m_ui16NumEnvRec
           << m_ui16SeqNum;

    vector<EnvironmentRecordPtr>::const_iterator citr = m_vEnvRecords.begin();
    vector<EnvironmentRecordPtr>::const_iterator citrEnd = m_vEnvRecords.end();
    for( ; citr != citrEnd; ++citr )
    {
        ( *citr )->Encode( stream );
    }
}